

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O2

Reals __thiscall
Omega_h::get_curv_edge_curvatures_dim<2>
          (Omega_h *this,Mesh *mesh,LOs *curv_edge2edge,Reals *curv_edge_tangents,
          LOs *curv_vert2vert,Reals *curv_vert_tangents)

{
  Alloc *pAVar1;
  LO LVar2;
  void *extraout_RDX;
  size_t sVar3;
  Reals RVar4;
  Write<double> curv_edges2curvature_w;
  Write<int> local_240;
  Write<double> local_230;
  Write<double> local_220;
  Reals curv_edges2curvature;
  Reals coords;
  Write<int> local_1f0;
  Read<signed_char> ev_flips;
  Write<int> local_1d0;
  LOs edges2verts;
  Write<int> local_1b0;
  LOs edge2curv_edge;
  Write<int> local_190;
  LOs vert2curv_vert;
  type f;
  Adj verts2edges;
  Adj local_c0;
  Adj local_90;
  Adj curv_verts2edges;
  
  Write<int>::Write(&local_190,&curv_vert2vert->write_);
  LVar2 = Mesh::nverts(mesh);
  invert_injective_map((Omega_h *)&vert2curv_vert,(LOs *)&local_190,LVar2);
  Write<int>::~Write(&local_190);
  Write<int>::Write(&local_1b0,&curv_edge2edge->write_);
  LVar2 = Mesh::nedges(mesh);
  invert_injective_map((Omega_h *)&edge2curv_edge,(LOs *)&local_1b0,LVar2);
  Write<int>::~Write(&local_1b0);
  Mesh::ask_verts_of((Mesh *)&edges2verts,(Int)mesh);
  pAVar1 = (curv_edge2edge->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar3 = pAVar1->size;
  }
  else {
    sVar3 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&f,"",(allocator *)&verts2edges);
  LVar2 = (LO)(sVar3 >> 2);
  Write<double>::Write(&curv_edges2curvature_w,LVar2,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  Mesh::ask_up(&verts2edges,mesh,0,1);
  Write<int>::Write(&local_1d0,&curv_vert2vert->write_);
  Adj::Adj(&local_90,&verts2edges);
  unmap_adjacency(&curv_verts2edges,(LOs *)&local_1d0,&local_90);
  Adj::~Adj(&local_90);
  Write<int>::~Write(&local_1d0);
  Adj::Adj(&local_c0,&curv_verts2edges);
  Write<int>::Write(&local_1f0,&edge2curv_edge.write_);
  get_curv_edge_vert_flips((Omega_h *)&ev_flips,mesh,&local_c0,(LOs *)&local_1f0);
  Write<int>::~Write(&local_1f0);
  Adj::~Adj(&local_c0);
  Mesh::coords((Mesh *)&coords);
  Write<int>::Write((Write<int> *)&f,&curv_edge2edge->write_);
  Write<double>::Write(&f.curv_edge_tangents.write_,&curv_edge_tangents->write_);
  Write<int>::Write(&f.edges2verts.write_,&edges2verts.write_);
  Write<int>::Write(&f.vert2curv_vert.write_,&vert2curv_vert.write_);
  Write<double>::Write(&f.curv_vert_tangents.write_,&curv_vert_tangents->write_);
  Write<signed_char>::Write(&f.ev_flips.write_,&ev_flips.write_);
  Write<double>::Write(&f.coords.write_,&coords.write_);
  Write<double>::Write(&f.curv_edges2curvature_w,&curv_edges2curvature_w);
  parallel_for<Omega_h::get_curv_edge_curvatures_dim<2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,Omega_h::Read<int>,Omega_h::Read<double>)::_lambda(int)_1_>
            (LVar2,&f,"get_curv_edge_curvatures");
  Write<double>::Write(&local_220,&curv_edges2curvature_w);
  Read<double>::Read((Read<signed_char> *)&curv_edges2curvature,&local_220);
  Write<double>::~Write(&local_220);
  Write<double>::Write(&local_230,&curv_edges2curvature.write_);
  Write<int>::Write(&local_240,&curv_edge2edge->write_);
  Mesh::sync_subset_array<double>
            ((Mesh *)this,(Int)mesh,(Read<double> *)0x1,(LOs *)&local_230,0.0,(Int)&local_240);
  Write<int>::~Write(&local_240);
  Write<double>::~Write(&local_230);
  Write<double>::~Write(&curv_edges2curvature.write_);
  get_curv_edge_curvatures_dim<2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,Omega_h::Read<int>,Omega_h::Read<double>)
  ::{lambda(int)#1}::~Mesh((_lambda_int__1_ *)&f);
  Write<double>::~Write(&coords.write_);
  Write<signed_char>::~Write(&ev_flips.write_);
  Adj::~Adj(&curv_verts2edges);
  Adj::~Adj(&verts2edges);
  Write<double>::~Write(&curv_edges2curvature_w);
  Write<int>::~Write(&edges2verts.write_);
  Write<int>::~Write(&edge2curv_edge.write_);
  Write<int>::~Write(&vert2curv_vert.write_);
  RVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar4.write_.shared_alloc_;
}

Assistant:

Reals get_curv_edge_curvatures_dim(Mesh* mesh, LOs curv_edge2edge,
    Reals curv_edge_tangents, LOs curv_vert2vert, Reals curv_vert_tangents) {
  auto vert2curv_vert = invert_injective_map(curv_vert2vert, mesh->nverts());
  auto edge2curv_edge = invert_injective_map(curv_edge2edge, mesh->nedges());
  auto edges2verts = mesh->ask_verts_of(EDGE);
  auto ncurv_edges = curv_edge2edge.size();
  auto curv_edges2curvature_w = Write<Real>(ncurv_edges);
  auto verts2edges = mesh->ask_up(VERT, EDGE);
  auto curv_verts2edges = unmap_adjacency(curv_vert2vert, verts2edges);
  auto ev_flips =
      get_curv_edge_vert_flips(mesh, curv_verts2edges, edge2curv_edge);
  auto coords = mesh->coords();
  auto f = OMEGA_H_LAMBDA(LO curv_edge) {
    auto edge = curv_edge2edge[curv_edge];
    auto et = get_vector<dim>(curv_edge_tangents, curv_edge);
    Few<Vector<dim>, 2> ts;
    auto eev2v = gather_verts<2>(edges2verts, edge);
    for (Int eev = 0; eev < 2; ++eev) {
      auto vert = eev2v[eev];
      auto curv_vert = vert2curv_vert[vert];
      Vector<dim> vt;
      if (curv_vert >= 0) {
        vt = get_vector<dim>(curv_vert_tangents, curv_vert);
        if (ev_flips[edge * 2 + eev]) vt = -vt;
      } else {
        vt = et;
      }
      ts[eev] = vt;
    }
    auto p = gather_vectors<2, dim>(coords, eev2v);
    auto e = p[1] - p[0];
    auto l = norm(e);
    auto u = e / l;
    auto dt = ts[1] - ts[0];
    auto curvature = norm(dt - (u * (dt * u))) / l;
    curv_edges2curvature_w[curv_edge] = curvature;
  };
  parallel_for(ncurv_edges, f, "get_curv_edge_curvatures");
  auto curv_edges2curvature = Reals(curv_edges2curvature_w);
  return mesh->sync_subset_array(
      EDGE, curv_edges2curvature, curv_edge2edge, 0.0, 1);
}